

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdist.c
# Opt level: O3

double normalinv(double p,double mu,double sigma)

{
  char *__format;
  double dVar1;
  
  if (sigma < 0.0) {
    __format = "Standard Deviation (Sigma) must be non-negative";
  }
  else {
    if ((0.0 <= p) && (p <= 1.0)) {
      dVar1 = erfinv(p + p + -1.0);
      return dVar1 * 1.4142135623730951 * sigma + mu;
    }
    __format = "Probablity Values can only take values between 0.0 and 1.0";
  }
  printf(__format);
  exit(1);
}

Assistant:

double normalinv(double p, double mu, double sigma) {
	double oup,t;
	if (sigma < 0.) {
		printf("Standard Deviation (Sigma) must be non-negative");
		exit(1);
	}
	
	if (p < 0. || p > 1.0) {
		printf("Probablity Values can only take values between 0.0 and 1.0");
		exit(1);
	}
	
	t = sqrt(2.0) * erfinv(2.0 * p - 1.0);
	oup = t * sigma + mu;
	
	return oup;
}